

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.cpp
# Opt level: O1

void __thiscall
sai::Document::IterateLayerFiles(Document *this,function<bool_(sai::VirtualFileEntry_&)> *LayerProc)

{
  bool bVar1;
  undefined8 uVar2;
  int iVar3;
  span<std::byte,_18446744073709551615UL> Destination;
  span<std::byte,_18446744073709551615UL> Destination_00;
  char LayerPath [32];
  uint temp;
  optional<sai::VirtualFileEntry> LayerTableFile;
  char local_138 [40];
  VirtualFileEntry local_110;
  char local_a8;
  optional<sai::VirtualFileEntry> local_a0;
  
  VirtualFileSystem::GetEntry(&local_a0,&this->super_VirtualFileSystem,"laytbl");
  if (local_a0.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
      super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
      super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged == true) {
    Destination._M_extent._M_extent_value = 4;
    Destination._M_ptr = (pointer)&local_110;
    VirtualFileEntry::Read((VirtualFileEntry *)&local_a0,Destination);
    iVar3 = local_110.FATData.Flags + 1;
    do {
      iVar3 = iVar3 + -1;
      if (iVar3 == 0) break;
      Destination_00._M_extent._M_extent_value = 8;
      Destination_00._M_ptr = (pointer)&local_110;
      VirtualFileEntry::Read((VirtualFileEntry *)&local_a0,Destination_00);
      local_138[0x10] = '\0';
      local_138[0x11] = '\0';
      local_138[0x12] = '\0';
      local_138[0x13] = '\0';
      local_138[0x14] = '\0';
      local_138[0x15] = '\0';
      local_138[0x16] = '\0';
      local_138[0x17] = '\0';
      local_138[0x18] = '\0';
      local_138[0x19] = '\0';
      local_138[0x1a] = '\0';
      local_138[0x1b] = '\0';
      local_138[0x1c] = '\0';
      local_138[0x1d] = '\0';
      local_138[0x1e] = '\0';
      local_138[0x1f] = '\0';
      local_138[0] = '\0';
      local_138[1] = '\0';
      local_138[2] = '\0';
      local_138[3] = '\0';
      local_138[4] = '\0';
      local_138[5] = '\0';
      local_138[6] = '\0';
      local_138[7] = '\0';
      local_138[8] = '\0';
      local_138[9] = '\0';
      local_138[10] = '\0';
      local_138[0xb] = '\0';
      local_138[0xc] = '\0';
      local_138[0xd] = '\0';
      local_138[0xe] = '\0';
      local_138[0xf] = '\0';
      snprintf(local_138,0x20,"/layers/%08x",(ulong)local_110.FATData.Flags);
      VirtualFileSystem::GetEntry
                ((optional<sai::VirtualFileEntry> *)&local_110,&this->super_VirtualFileSystem,
                 local_138);
      if (local_a8 == '\x01') {
        if ((LayerProc->super__Function_base)._M_manager == (_Manager_type)0x0) {
          uVar2 = std::__throw_bad_function_call();
          if (local_a0.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
              super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
              super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged == true) {
            local_a0.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
            super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
            super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged = false;
            VirtualFileEntry::~VirtualFileEntry((VirtualFileEntry *)&local_a0);
          }
          _Unwind_Resume(uVar2);
        }
        bVar1 = (*LayerProc->_M_invoker)((_Any_data *)LayerProc,&local_110);
        if (bVar1) goto LAB_00107aed;
        bVar1 = false;
      }
      else {
LAB_00107aed:
        bVar1 = true;
      }
      if (local_a8 == '\x01') {
        local_a8 = '\0';
        VirtualFileEntry::~VirtualFileEntry(&local_110);
      }
    } while (bVar1);
  }
  if (local_a0.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
      super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
      super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged == true) {
    local_a0.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
    super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
    super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged = false;
    VirtualFileEntry::~VirtualFileEntry((VirtualFileEntry *)&local_a0);
  }
  return;
}

Assistant:

void Document::IterateLayerFiles(const std::function<bool(VirtualFileEntry&)>& LayerProc)
{
	if( std::optional<VirtualFileEntry> LayerTableFile = GetEntry("laytbl"); LayerTableFile )
	{
		std::uint32_t LayerCount = LayerTableFile->Read<std::uint32_t>();
		while( LayerCount-- ) // Read each layer entry
		{
			const LayerTableEntry CurLayerEntry = LayerTableFile->Read<LayerTableEntry>();
			char                  LayerPath[32] = {};
			std::snprintf(LayerPath, 32u, "/layers/%08x", CurLayerEntry.Identifier);
			if( std::optional<VirtualFileEntry> LayerFile = GetEntry(LayerPath); LayerFile )
			{
				if( !LayerProc(*LayerFile) )
					break;
			}
		}
	}
}